

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  undefined8 uVar1;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 auStack_58 [16];
  cmListFileBacktrace local_48;
  
  cmMakefile::GetBacktrace((cmListFileBacktrace *)(auStack_58 + 0x10),mf);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)auStack_58,(cmListFileBacktrace *)(auStack_58 + 0x10));
  std::__cxx11::string::_M_assign((string *)this);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)(auStack_58 + 8),(string *)auStack_58);
  uVar1 = auStack_58._8_8_;
  auStack_58._8_8_ = 0;
  this->NameExpression = (cmCompiledGeneratorExpression *)uVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(auStack_58 + 8));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)auStack_58);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)(auStack_58 + 0x10));
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(&backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}